

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_sample.c
# Opt level: O0

_Bool al_set_default_mixer(ALLEGRO_MIXER *mixer)

{
  _Bool _Var1;
  int iVar2;
  long *plVar3;
  ALLEGRO_SAMPLE_INSTANCE *pAVar4;
  ulong uVar5;
  ALLEGRO_MIXER *in_RDI;
  AUTO_SAMPLE *slot;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar6;
  int iVar7;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_RDI != default_mixer) {
    iVar6 = 0;
    default_mixer = in_RDI;
    while (iVar7 = iVar6, iVar2 = _al_vector_size(&auto_samples), iVar6 < iVar2) {
      plVar3 = (long *)_al_vector_ref(&auto_samples,iVar7);
      *(undefined4 *)(plVar3 + 1) = 0;
      al_destroy_sample_instance((ALLEGRO_SAMPLE_INSTANCE *)0x10f470);
      *(undefined1 *)((long)plVar3 + 0xc) = 0;
      pAVar4 = al_create_sample_instance
                         ((ALLEGRO_SAMPLE *)CONCAT44(iVar7,in_stack_ffffffffffffffe8));
      *plVar3 = (long)pAVar4;
      if (*plVar3 == 0) {
        uVar5 = _al_trace_prefix(__al_debug_channel,3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_sample.c"
                                 ,0x120,"al_set_default_mixer");
        if ((uVar5 & 1) != 0) {
          _al_trace_suffix("al_create_sample failed\n");
        }
LAB_0010f53f:
        free_sample_vector();
        default_mixer = (ALLEGRO_MIXER *)0x0;
        return false;
      }
      _Var1 = al_attach_sample_instance_to_mixer
                        ((ALLEGRO_SAMPLE_INSTANCE *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
      if (!_Var1) {
        uVar5 = _al_trace_prefix(__al_debug_channel,3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_sample.c"
                                 ,0x124,"al_set_default_mixer");
        if ((uVar5 & 1) != 0) {
          _al_trace_suffix("al_attach_mixer_to_sample failed\n");
        }
        goto LAB_0010f53f;
      }
      iVar6 = iVar7 + 1;
    }
  }
  return true;
}

Assistant:

bool al_set_default_mixer(ALLEGRO_MIXER *mixer)
{
   ASSERT(mixer != NULL);

   if (mixer != default_mixer) {
      int i;

      default_mixer = mixer;

      /* Destroy all current sample instances, recreate them, and
       * attach them to the new mixer */
      for (i = 0; i < (int) _al_vector_size(&auto_samples); i++) {
         AUTO_SAMPLE *slot = _al_vector_ref(&auto_samples, i);

         slot->id = 0;
         al_destroy_sample_instance(slot->instance);
         slot->locked = false;

         slot->instance = al_create_sample_instance(NULL);
         if (!slot->instance) {
            ALLEGRO_ERROR("al_create_sample failed\n");
            goto Error;
         }
         if (!al_attach_sample_instance_to_mixer(slot->instance, default_mixer)) {
            ALLEGRO_ERROR("al_attach_mixer_to_sample failed\n");
            goto Error;
         }
      }      
   }

   return true;

Error:
   free_sample_vector();
   default_mixer = NULL;   
   return false;
}